

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

TriggerPrg * codeRowTrigger(Parse *pParse,Trigger *pTrigger,Table *pTab,int orconf)

{
  long lVar1;
  int iVar2;
  Vdbe *p;
  Vdbe *pVVar3;
  sqlite3 *psVar4;
  int in_ECX;
  Trigger *in_RSI;
  sqlite3 *in_RDI;
  long in_FS_OFFSET;
  int iEndTrigger;
  SubProgram *pProgram;
  Vdbe *v;
  Expr *pWhen;
  TriggerPrg *pPrg;
  sqlite3 *db;
  Parse *pTop;
  NameContext sNC;
  Parse sSubParse;
  undefined4 in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffd9c;
  sqlite3 *in_stack_fffffffffffffda0;
  Vdbe *in_stack_fffffffffffffda8;
  sqlite3 *db_00;
  int addr;
  sqlite3 *pExpr;
  undefined4 in_stack_fffffffffffffdf0;
  TriggerPrg *local_1f0;
  undefined1 *local_1e8 [3];
  int in_stack_fffffffffffffe34;
  TriggerStep *in_stack_fffffffffffffe38;
  Parse *in_stack_fffffffffffffe40;
  undefined1 local_1b0 [16];
  int local_178;
  int local_174;
  u32 local_d8;
  u32 local_d4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  db_00 = in_RDI;
  if (*(long *)(in_RDI->aLimit + 10) != 0) {
    db_00 = *(sqlite3 **)(in_RDI->aLimit + 10);
  }
  psVar4 = (sqlite3 *)in_RDI->pVfs;
  pExpr = db_00;
  memset(local_1e8,0xaa,0x38);
  addr = 0;
  memset(local_1b0,0xaa,0x1a8);
  local_1f0 = (TriggerPrg *)
              sqlite3DbMallocZero(in_stack_fffffffffffffda0,
                                  CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  if (local_1f0 == (TriggerPrg *)0x0) {
    local_1f0 = (TriggerPrg *)0x0;
  }
  else {
    local_1f0->pNext = *(TriggerPrg **)&pExpr->init;
    *(TriggerPrg **)&pExpr->init = local_1f0;
    p = (Vdbe *)sqlite3DbMallocZero(in_stack_fffffffffffffda0,
                                    CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    local_1f0->pProgram = (SubProgram *)p;
    if (p == (Vdbe *)0x0) {
      local_1f0 = (TriggerPrg *)0x0;
    }
    else {
      sqlite3VdbeLinkSubProgram((Vdbe *)pExpr->pDfltColl,(SubProgram *)p);
      local_1f0->pTrigger = in_RSI;
      local_1f0->orconf = in_ECX;
      local_1f0->aColmask[0] = 0xffffffff;
      local_1f0->aColmask[1] = 0xffffffff;
      sqlite3ParseObjectInit
                ((Parse *)in_stack_fffffffffffffda0,
                 (sqlite3 *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      memset(local_1e8,0,0x38);
      local_1e8[0] = local_1b0;
      pVVar3 = sqlite3GetVdbe((Parse *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98)
                             );
      if (pVVar3 == (Vdbe *)0x0) {
        transferParseError((Parse *)in_stack_fffffffffffffda0,
                           (Parse *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      }
      else {
        if (in_RSI->zName != (char *)0x0) {
          sqlite3MPrintf(psVar4,"-- TRIGGER %s",in_RSI->zName);
          sqlite3VdbeChangeP4(p,addr,(char *)db_00,(int)((ulong)pVVar3 >> 0x20));
          in_stack_fffffffffffffda8 = pVVar3;
        }
        if (in_RSI->pWhen != (Expr *)0x0) {
          sqlite3ExprDup(db_00,(Expr *)in_stack_fffffffffffffda8,
                         (int)((ulong)in_stack_fffffffffffffda0 >> 0x20));
          if ((psVar4->mallocFailed == '\0') &&
             (iVar2 = sqlite3ResolveExprNames
                                ((NameContext *)db_00,(Expr *)in_stack_fffffffffffffda8), iVar2 == 0
             )) {
            addr = sqlite3VdbeMakeLabel((Parse *)local_1b0);
            sqlite3ExprIfFalse((Parse *)CONCAT44(in_ECX,in_stack_fffffffffffffdf0),(Expr *)pExpr,
                               (int)((ulong)psVar4 >> 0x20),(int)psVar4);
          }
          sqlite3ExprDelete(in_stack_fffffffffffffda0,
                            (Expr *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
        }
        codeTriggerProgram(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                           in_stack_fffffffffffffe34);
        if (addr != 0) {
          sqlite3VdbeResolveLabel((Vdbe *)db_00,(int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
        }
        sqlite3VdbeAddOp0((Vdbe *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c);
        transferParseError((Parse *)in_stack_fffffffffffffda0,
                           (Parse *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
        if (*(int *)((long)&in_RDI->flags + 4) == 0) {
          psVar4 = (sqlite3 *)
                   sqlite3VdbeTakeOpArray
                             ((Vdbe *)db_00,(int *)in_stack_fffffffffffffda8,
                              (int *)in_stack_fffffffffffffda0);
          p->db = psVar4;
        }
        *(int *)((long)&p->ppVPrev + 4) = local_174;
        *(int *)&p->pVNext = local_178;
        *(Trigger **)&p->nVar = in_RSI;
        local_1f0->aColmask[0] = local_d8;
        local_1f0->aColmask[1] = local_d4;
        sqlite3VdbeDelete((Vdbe *)in_stack_fffffffffffffda0);
      }
      sqlite3ParseObjectReset((Parse *)db_00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_1f0;
}

Assistant:

static TriggerPrg *codeRowTrigger(
  Parse *pParse,       /* Current parse context */
  Trigger *pTrigger,   /* Trigger to code */
  Table *pTab,         /* The table pTrigger is attached to */
  int orconf           /* ON CONFLICT policy to code trigger program with */
){
  Parse *pTop = sqlite3ParseToplevel(pParse);
  sqlite3 *db = pParse->db;   /* Database handle */
  TriggerPrg *pPrg;           /* Value to return */
  Expr *pWhen = 0;            /* Duplicate of trigger WHEN expression */
  Vdbe *v;                    /* Temporary VM */
  NameContext sNC;            /* Name context for sub-vdbe */
  SubProgram *pProgram = 0;   /* Sub-vdbe for trigger program */
  int iEndTrigger = 0;        /* Label to jump to if WHEN is false */
  Parse sSubParse;            /* Parse context for sub-vdbe */

  assert( pTrigger->zName==0 || pTab==tableOfTrigger(pTrigger) );
  assert( pTop->pVdbe );

  /* Allocate the TriggerPrg and SubProgram objects. To ensure that they
  ** are freed if an error occurs, link them into the Parse.pTriggerPrg
  ** list of the top-level Parse object sooner rather than later.  */
  pPrg = sqlite3DbMallocZero(db, sizeof(TriggerPrg));
  if( !pPrg ) return 0;
  pPrg->pNext = pTop->pTriggerPrg;
  pTop->pTriggerPrg = pPrg;
  pPrg->pProgram = pProgram = sqlite3DbMallocZero(db, sizeof(SubProgram));
  if( !pProgram ) return 0;
  sqlite3VdbeLinkSubProgram(pTop->pVdbe, pProgram);
  pPrg->pTrigger = pTrigger;
  pPrg->orconf = orconf;
  pPrg->aColmask[0] = 0xffffffff;
  pPrg->aColmask[1] = 0xffffffff;

  /* Allocate and populate a new Parse context to use for coding the
  ** trigger sub-program.  */
  sqlite3ParseObjectInit(&sSubParse, db);
  memset(&sNC, 0, sizeof(sNC));
  sNC.pParse = &sSubParse;
  sSubParse.pTriggerTab = pTab;
  sSubParse.pToplevel = pTop;
  sSubParse.zAuthContext = pTrigger->zName;
  sSubParse.eTriggerOp = pTrigger->op;
  sSubParse.nQueryLoop = pParse->nQueryLoop;
  sSubParse.prepFlags = pParse->prepFlags;

  v = sqlite3GetVdbe(&sSubParse);
  if( v ){
    VdbeComment((v, "Start: %s.%s (%s %s%s%s ON %s)",
      pTrigger->zName, onErrorText(orconf),
      (pTrigger->tr_tm==TRIGGER_BEFORE ? "BEFORE" : "AFTER"),
        (pTrigger->op==TK_UPDATE ? "UPDATE" : ""),
        (pTrigger->op==TK_INSERT ? "INSERT" : ""),
        (pTrigger->op==TK_DELETE ? "DELETE" : ""),
      pTab->zName
    ));
#ifndef SQLITE_OMIT_TRACE
    if( pTrigger->zName ){
      sqlite3VdbeChangeP4(v, -1,
        sqlite3MPrintf(db, "-- TRIGGER %s", pTrigger->zName), P4_DYNAMIC
      );
    }
#endif

    /* If one was specified, code the WHEN clause. If it evaluates to false
    ** (or NULL) the sub-vdbe is immediately halted by jumping to the
    ** OP_Halt inserted at the end of the program.  */
    if( pTrigger->pWhen ){
      pWhen = sqlite3ExprDup(db, pTrigger->pWhen, 0);
      if( db->mallocFailed==0
       && SQLITE_OK==sqlite3ResolveExprNames(&sNC, pWhen)
      ){
        iEndTrigger = sqlite3VdbeMakeLabel(&sSubParse);
        sqlite3ExprIfFalse(&sSubParse, pWhen, iEndTrigger, SQLITE_JUMPIFNULL);
      }
      sqlite3ExprDelete(db, pWhen);
    }

    /* Code the trigger program into the sub-vdbe. */
    codeTriggerProgram(&sSubParse, pTrigger->step_list, orconf);

    /* Insert an OP_Halt at the end of the sub-program. */
    if( iEndTrigger ){
      sqlite3VdbeResolveLabel(v, iEndTrigger);
    }
    sqlite3VdbeAddOp0(v, OP_Halt);
    VdbeComment((v, "End: %s.%s", pTrigger->zName, onErrorText(orconf)));
    transferParseError(pParse, &sSubParse);

    if( pParse->nErr==0 ){
      assert( db->mallocFailed==0 );
      pProgram->aOp = sqlite3VdbeTakeOpArray(v, &pProgram->nOp, &pTop->nMaxArg);
    }
    pProgram->nMem = sSubParse.nMem;
    pProgram->nCsr = sSubParse.nTab;
    pProgram->token = (void *)pTrigger;
    pPrg->aColmask[0] = sSubParse.oldmask;
    pPrg->aColmask[1] = sSubParse.newmask;
    sqlite3VdbeDelete(v);
  }else{
    transferParseError(pParse, &sSubParse);
  }

  assert( !sSubParse.pTriggerPrg && !sSubParse.nMaxArg );
  sqlite3ParseObjectReset(&sSubParse);
  return pPrg;
}